

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O3

void __thiscall
duckdb::ValidityMask::SliceInPlace
          (ValidityMask *this,ValidityMask *other,idx_t target_offset,idx_t source_offset,
          idx_t count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  unsigned_long *puVar2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  uint uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  sbyte sVar9;
  sbyte sVar10;
  uint uVar11;
  idx_t idx_in_entry;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  ulong *puVar13;
  ulong uVar14;
  unsigned_long uVar15;
  unsigned_long *puVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  _Var8._M_head_impl = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (_Var8._M_head_impl == (unsigned_long *)0x0) {
    if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      return;
    }
    local_38 = (this->super_TemplatedValidityMask<unsigned_long>).capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_48,&local_38);
    p_Var5 = p_Stack_40;
    peVar4 = local_48;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar4;
    (this->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
       p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(this->super_TemplatedValidityMask<unsigned_long>).validity_data);
    _Var8._M_head_impl =
         (pTVar7->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var8._M_head_impl;
  }
  uVar18 = (uint)count & 0x3f;
  uVar19 = count >> 6;
  sVar9 = (sbyte)uVar18;
  if ((((uint)target_offset | (uint)source_offset) & 0x3f) == 0) {
    puVar2 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    uVar17 = target_offset + 0x3f >> 6;
    if (puVar2 == (unsigned_long *)0x0) {
      switchD_00569a20::default(_Var8._M_head_impl + uVar17,0xff,uVar19 * 8);
      uVar15 = 0xffffffffffffffff;
      if ((count & 0x3f) == 0) {
        return;
      }
    }
    else {
      puVar2 = puVar2 + (source_offset + 0x3f >> 6);
      switchD_00b041bd::default(_Var8._M_head_impl + uVar17,puVar2,uVar19 * 8);
      if ((count & 0x3f) == 0) {
        return;
      }
      uVar15 = puVar2[uVar19];
    }
    uVar14 = (uVar15 << (-sVar9 & 0x3fU)) >> (-sVar9 & 0x3fU);
    puVar13 = _Var8._M_head_impl + uVar17 + uVar19;
  }
  else {
    if ((target_offset & 0x3f) != 0) {
      if (count == 0) {
        return;
      }
      _Var12._M_head_impl = _Var8._M_head_impl;
      do {
        puVar2 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          _Var8._M_head_impl = _Var12._M_head_impl;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            _Var12._M_head_impl = (unsigned_long *)0x0;
            goto LAB_002d7357;
          }
LAB_002d72c5:
          _Var8._M_head_impl[target_offset >> 6] =
               _Var8._M_head_impl[target_offset >> 6] | 1L << ((byte)target_offset & 0x3f);
        }
        else if ((puVar2[source_offset >> 6] >> (source_offset & 0x3f) & 1) == 0) {
          if (_Var8._M_head_impl == (unsigned_long *)0x0) {
            local_38 = (this->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_48,&local_38);
            p_Var5 = p_Stack_40;
            peVar4 = local_48;
            local_48 = (element_type *)0x0;
            p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var1 = (this->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (this->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            (this->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
               p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
            }
            pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(this->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var8._M_head_impl =
                 (pTVar7->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var8._M_head_impl;
            _Var12._M_head_impl = _Var8._M_head_impl;
          }
          bVar3 = (byte)target_offset & 0x3f;
          _Var8._M_head_impl[target_offset >> 6] =
               _Var8._M_head_impl[target_offset >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        else {
          if (_Var8._M_head_impl != (unsigned_long *)0x0) goto LAB_002d72c5;
LAB_002d7357:
          _Var8._M_head_impl = (unsigned_long *)0x0;
        }
        source_offset = source_offset + 1;
        target_offset = target_offset + 1;
        count = count - 1;
        if (count == 0) {
          return;
        }
      } while( true );
    }
    uVar11 = (uint)source_offset & 0x3f;
    uVar6 = 0x40 - uVar11;
    puVar13 = (ulong *)((long)_Var8._M_head_impl + (target_offset >> 3));
    puVar2 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask +
             (source_offset >> 6);
    puVar16 = puVar2 + 1;
    uVar15 = *puVar2;
    sVar10 = (sbyte)uVar11;
    bVar3 = (byte)uVar6;
    if (0x3f < count) {
      do {
        uVar17 = uVar15 >> sVar10;
        uVar15 = *puVar16;
        *puVar13 = uVar15 << (bVar3 & 0x3f) | uVar17;
        puVar13 = puVar13 + 1;
        puVar16 = puVar16 + 1;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
    }
    if ((count & 0x3f) == 0) {
      return;
    }
    uVar19 = uVar15 >> sVar10;
    if (uVar6 < uVar18) {
      uVar19 = uVar19 | *puVar16 << (bVar3 & 0x3f);
    }
    uVar14 = (uVar19 << (-sVar9 & 0x3fU)) >> (-sVar9 & 0x3fU);
  }
  *puVar13 = (*puVar13 >> sVar9) << sVar9 | uVar14;
  return;
}

Assistant:

void ValidityMask::SliceInPlace(const ValidityMask &other, idx_t target_offset, idx_t source_offset, idx_t count) {
	if (AllValid() && other.AllValid()) {
		// Both validity masks are uninitialized, nothing to do
		return;
	}
	EnsureWritable();
	const idx_t ragged = count % BITS_PER_VALUE;
	const idx_t entire_units = count / BITS_PER_VALUE;
	if (IsAligned(source_offset) && IsAligned(target_offset)) {
		auto target_validity = GetData();
		auto source_validity = other.GetData();
		auto source_offset_entries = EntryCount(source_offset);
		auto target_offset_entries = EntryCount(target_offset);
		if (!source_validity) {
			// if source has no validity mask - set all bytes to 1
			memset(target_validity + target_offset_entries, 0xFF, sizeof(validity_t) * entire_units);
		} else {
			memcpy(target_validity + target_offset_entries, source_validity + source_offset_entries,
			       sizeof(validity_t) * entire_units);
		}
		if (ragged) {
			auto src_entry =
			    source_validity ? source_validity[source_offset_entries + entire_units] : ValidityBuffer::MAX_ENTRY;
			src_entry &= (ValidityBuffer::MAX_ENTRY >> (BITS_PER_VALUE - ragged));

			target_validity += target_offset_entries + entire_units;
			auto tgt_entry = *target_validity;
			tgt_entry &= (ValidityBuffer::MAX_ENTRY << ragged);

			*target_validity = tgt_entry | src_entry;
		}
		return;
	} else if (IsAligned(target_offset)) {
		//	Simple common case where we are shifting into an aligned mask (e.g., 0 in Slice above)
		const idx_t tail = source_offset % BITS_PER_VALUE;
		const idx_t head = BITS_PER_VALUE - tail;
		auto source_validity = other.GetData() + (source_offset / BITS_PER_VALUE);
		auto target_validity = this->GetData() + (target_offset / BITS_PER_VALUE);
		auto src_entry = *source_validity++;
		for (idx_t i = 0; i < entire_units; ++i) {
			//	Start with head of previous src
			validity_t tgt_entry = src_entry >> tail;
			src_entry = *source_validity++;
			// 	Add in tail of current src
			tgt_entry |= (src_entry << head);
			*target_validity++ = tgt_entry;
		}
		//	Finish last ragged entry
		if (ragged) {
			//	Start with head of previous src
			validity_t tgt_entry = (src_entry >> tail);
			//  Add in the tail of the next src, if head was too small
			if (head < ragged) {
				src_entry = *source_validity++;
				tgt_entry |= (src_entry << head);
			}
			//  Mask off the bits that go past the ragged end
			tgt_entry &= (ValidityBuffer::MAX_ENTRY >> (BITS_PER_VALUE - ragged));
			//	Restore the ragged end of the target
			tgt_entry |= *target_validity & (ValidityBuffer::MAX_ENTRY << ragged);
			*target_validity++ = tgt_entry;
		}
		return;
	}

	// FIXME: use bitwise operations here
#if 1
	for (idx_t i = 0; i < count; i++) {
		Set(target_offset + i, other.RowIsValid(source_offset + i));
	}
#else
	// first shift the "whole" units
	idx_t entire_units = offset / BITS_PER_VALUE;
	idx_t sub_units = offset - entire_units * BITS_PER_VALUE;
	if (entire_units > 0) {
		idx_t validity_idx;
		for (validity_idx = 0; validity_idx + entire_units < STANDARD_ENTRY_COUNT; validity_idx++) {
			new_mask.validity_mask[validity_idx] = other.validity_mask[validity_idx + entire_units];
		}
	}
	// now we shift the remaining sub units
	// this gets a bit more complicated because we have to shift over the borders of the entries
	// e.g. suppose we have 2 entries of length 4 and we left-shift by two
	// 0101|1010
	// a regular left-shift of both gets us:
	// 0100|1000
	// we then OR the overflow (right-shifted by BITS_PER_VALUE - offset) together to get the correct result
	// 0100|1000 ->
	// 0110|1000
	if (sub_units > 0) {
		idx_t validity_idx;
		for (validity_idx = 0; validity_idx + 1 < STANDARD_ENTRY_COUNT; validity_idx++) {
			new_mask.validity_mask[validity_idx] =
			    (other.validity_mask[validity_idx] >> sub_units) |
			    (other.validity_mask[validity_idx + 1] << (BITS_PER_VALUE - sub_units));
		}
		new_mask.validity_mask[validity_idx] >>= sub_units;
	}
#ifdef DEBUG
	for (idx_t i = offset; i < STANDARD_VECTOR_SIZE; i++) {
		D_ASSERT(new_mask.RowIsValid(i - offset) == other.RowIsValid(i));
	}
	Initialize(new_mask);
#endif
#endif
}